

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::erase
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *pt,long *v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  Node *local_48;
  Node *local_30;
  Node *n;
  long *v_local;
  Vector2<long> *pt_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  if (this->root != (Node *)0x0) {
    local_30 = this->root;
    while (local_30 != (Node *)0x0) {
      bVar1 = Vector2<long>::operator==(&local_30->pt,pt);
      if ((bVar1) && (local_30->value == *v)) {
        delete_node(this,local_30);
        return true;
      }
      lVar2 = Vector2<long>::at(pt,local_30->dim);
      lVar3 = Vector2<long>::at(&local_30->pt,local_30->dim);
      if (lVar2 < lVar3) {
        local_48 = local_30->before;
      }
      else {
        local_48 = local_30->after_or_equal;
      }
      local_30 = local_48;
    }
  }
  return false;
}

Assistant:

bool KDTree<CoordType, ValueType>::erase(
    const CoordType& pt, const ValueType& v) {
  if (this->root == nullptr) {
    return false;
  }

  for (Node* n = this->root; n != nullptr;) {
    if ((n->pt == pt) && (n->value == v)) {
      this->delete_node(n);
      return true;
    }
    n = (pt.at(n->dim) < n->pt.at(n->dim)) ? n->before : n->after_or_equal;
  }
  return false;
}